

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

lys_type * find_orig_type(lys_type *par_type,LY_DATA_TYPE base_type)

{
  lys_type *plVar1;
  int local_3c;
  undefined8 uStack_38;
  int found;
  lys_type *tmp_type;
  lys_type *prev_type;
  lys_type *type;
  lys_type *plStack_18;
  LY_DATA_TYPE base_type_local;
  lys_type *par_type_local;
  
  prev_type = par_type;
  while ((prev_type->der->type).der != (lys_tpdf *)0x0) {
    prev_type = &prev_type->der->type;
  }
  if (prev_type->base == base_type) {
    par_type_local = prev_type;
  }
  else {
    type._4_4_ = base_type;
    plStack_18 = par_type;
    if ((prev_type->base == LY_TYPE_LEAFREF) && ((prev_type->value_flags & 1) == 0)) {
      if ((prev_type->info).lref.target == (lys_node_leaf *)0x0) {
        __assert_fail("type->info.lref.target",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                      ,0x224,"struct lys_type *find_orig_type(struct lys_type *, LY_DATA_TYPE)");
      }
      par_type_local = find_orig_type(&((prev_type->info).lref.target)->type,base_type);
    }
    else {
      if (prev_type->base == LY_TYPE_UNION) {
        tmp_type = (lys_type *)0x0;
        while( true ) {
          local_3c = 0;
          tmp_type = lyp_get_next_union_type(prev_type,tmp_type,&local_3c);
          if (tmp_type == (lys_type *)0x0) break;
          plVar1 = find_orig_type(tmp_type,type._4_4_);
          if (plVar1 != (lys_type *)0x0) {
            return plVar1;
          }
          uStack_38 = 0;
        }
      }
      par_type_local = (lys_type *)0x0;
    }
  }
  return par_type_local;
}

Assistant:

static struct lys_type *
find_orig_type(struct lys_type *par_type, LY_DATA_TYPE base_type)
{
    struct lys_type *type, *prev_type, *tmp_type;
    int found;

    /* go through typedefs */
    for (type = par_type; type->der->type.der; type = &type->der->type);

    if (type->base == base_type) {
        /* we have the result */
        return type;
    } else if ((type->base == LY_TYPE_LEAFREF) && !(type->value_flags & LY_VALUE_UNRES)) {
        /* go through the leafref */
        assert(type->info.lref.target);
        return find_orig_type(&((struct lys_node_leaf *)type->info.lref.target)->type, base_type);
    } else if (type->base == LY_TYPE_UNION) {
        /* go through all the union types */
        prev_type = NULL;
        found = 0;
        while ((prev_type = lyp_get_next_union_type(type, prev_type, &found))) {
            tmp_type = find_orig_type(prev_type, base_type);
            if (tmp_type) {
                return tmp_type;
            }
            found = 0;
        }
    }

    /* not found */
    return NULL;
}